

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O1

int lj_cf_jit_util_tracemc(lua_State *L)

{
  TValue *pTVar1;
  uint uVar2;
  int iVar3;
  GCstr *pGVar4;
  ulong uVar5;
  
  uVar2 = lj_lib_checkint(L,1);
  iVar3 = 0;
  if ((uVar2 == 0) || (uVar5 = (ulong)(L->glref).ptr32, *(uint *)(uVar5 + 0x3c4) <= uVar2)) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)*(uint *)(*(long *)(uVar5 + 0x3b8) + (ulong)uVar2 * 4);
  }
  if ((uVar5 != 0) && (*(char **)(uVar5 + 0x40) != (char *)0x0)) {
    pTVar1 = L->top;
    pGVar4 = lj_str_new(L,*(char **)(uVar5 + 0x40),(ulong)*(uint *)(uVar5 + 0x3c));
    pTVar1[-1].u32.lo = (uint32_t)pGVar4;
    *(undefined4 *)((long)pTVar1 + -4) = 0xfffffffb;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->n = (double)*(long *)(uVar5 + 0x40);
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->n = (double)*(int *)(uVar5 + 0x48);
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

LJLIB_CF(jit_util_tracemc)
{
  GCtrace *T = jit_checktrace(L);
  if (T && T->mcode != NULL) {
    setstrV(L, L->top-1, lj_str_new(L, (const char *)T->mcode, T->szmcode));
    setintptrV(L->top++, (intptr_t)(void *)T->mcode);
    setintV(L->top++, T->mcloop);
    return 3;
  }
  return 0;
}